

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalmapper.cpp
# Opt level: O0

void __thiscall QSignalMapper::removeMappings(QSignalMapper *this,QObject *sender)

{
  QSignalMapperPrivate *pQVar1;
  long in_FS_OFFSET;
  QSignalMapperPrivate *d;
  char local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QSignalMapper *)0x41d62a);
  QHash<QObject_*,_int>::remove(&pQVar1->intHash,local_10);
  QHash<QObject_*,_QString>::remove(&pQVar1->stringHash,local_10);
  QHash<QObject_*,_QObject_*>::remove(&pQVar1->objectHash,local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSignalMapper::removeMappings(QObject *sender)
{
    Q_D(QSignalMapper);

    d->intHash.remove(sender);
    d->stringHash.remove(sender);
    d->objectHash.remove(sender);
}